

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

size_t __thiscall Assimp::CFIReaderImpl::parseInt4(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  DeadlyImportError *this_00;
  size_t result_1;
  size_t result;
  uint8_t b;
  CFIReaderImpl *this_local;
  
  pbVar4 = this->dataP;
  this->dataP = pbVar4 + 1;
  bVar1 = *pbVar4;
  if ((bVar1 & 0x10) == 0) {
    uVar5 = bVar1 & 0xf;
LAB_00a37f85:
    this_local = (CFIReaderImpl *)(long)(int)uVar5;
    return (size_t)this_local;
  }
  if ((bVar1 & 0x1c) == 0x10) {
    if (0 < (long)this->dataEnd - (long)this->dataP) {
      pbVar4 = this->dataP;
      this->dataP = pbVar4 + 1;
      uVar5 = ((bVar1 & 3) << 8 | (uint)*pbVar4) + 0x10;
      goto LAB_00a37f85;
    }
  }
  else if ((bVar1 & 0x1c) == 0x14) {
    if (1 < (long)this->dataEnd - (long)this->dataP) {
      bVar2 = *this->dataP;
      bVar3 = this->dataP[1];
      this->dataP = this->dataP + 2;
      return (long)(int)(((bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3) + 0x410);
    }
  }
  else if ((((bVar1 & 0x1f) == 0x18) && (2 < (long)this->dataEnd - (long)this->dataP)) &&
          ((*this->dataP & 0xf0) == 0)) {
    bVar1 = *this->dataP;
    bVar2 = this->dataP[1];
    bVar3 = this->dataP[2];
    this->dataP = this->dataP + 3;
    return (long)(int)(((bVar1 & 0xf) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3) + 0x40410);
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

size_t parseInt4() { // C.28
        uint8_t b = *dataP++;
        if (!(b & 0x10)) { // xxx0.... (C.28.2)
            return b & 0x0f;
        }
        else if ((b & 0x1c) == 0x10) { // xxx100.. ........ (C.28.3)
            if (dataEnd - dataP > 0) {
                return (((b & 0x03) << 8) | *dataP++) + 0x10;
            }
        }
        else if ((b & 0x1c) == 0x14) { // xxx101.. ........ ........ (C.28.4)
            if (dataEnd - dataP > 1) {
                size_t result = (((b & 0x03) << 16) | (dataP[0] << 8) | dataP[1]) + 0x410;
                dataP += 2;
                return result;
            }
        }
        else if ((b & 0x1f) == 0x18) { // xxx11000 0000.... ........ ........ (C.28.5)
            if ((dataEnd - dataP > 2) && !(dataP[0] & 0xf0)) {
                size_t result = (((dataP[0] & 0x0f) << 16) | (dataP[1] << 8) | dataP[2]) + 0x40410;
                dataP += 3;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }